

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int handle_version_negotiation_packet(quicly_conn_t *conn,quicly_decoded_packet_t *packet)

{
  size_t sVar1;
  uint32_t uVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  ptls_iovec_t reason_phrase;
  
  sVar1 = (packet->octets).len;
  sVar4 = packet->encrypted_off;
  if ((sVar1 == sVar4) || (((int)sVar1 - (int)sVar4 & 3U) != 0)) {
    return 0x2000a;
  }
  uVar2 = 0;
  do {
    uVar5 = *(uint *)((packet->octets).base + sVar4);
    uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    if (uVar5 == 0xff00001d) {
      uVar2 = 0xff00001d;
      if (sVar1 - 4 == sVar4) goto LAB_0011e793;
    }
    else {
      if ((uVar5 == 0xff00001b) && (uVar2 == 0)) {
        uVar2 = 0xff00001b;
      }
      if (sVar1 - 4 == sVar4) {
        if (uVar2 == 0) {
          reason_phrase.len._4_4_ = 0;
          reason_phrase._0_12_ = ZEXT812(0x12a3d2);
          iVar3 = handle_close(conn,0xff05,0xffffffffffffffff,reason_phrase);
          return iVar3;
        }
LAB_0011e793:
        (conn->super).version = uVar2;
        iVar3 = reinstall_initial_encryption(conn,0x203);
        if (iVar3 != 0) {
          return iVar3;
        }
        iVar3 = discard_sentmap_by_epoch(conn,0xffffffff);
        return iVar3;
      }
    }
    sVar4 = sVar4 + 4;
  } while( true );
}

Assistant:

static int handle_version_negotiation_packet(quicly_conn_t *conn, quicly_decoded_packet_t *packet)
{
    const uint8_t *src = packet->octets.base + packet->encrypted_off, *end = packet->octets.base + packet->octets.len;
    uint32_t selected_version = 0;

    if (src == end || (end - src) % 4 != 0)
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;

    /* select in the precedence of _CURRENT -> _DRAFT27 -> fail */
    while (src != end) {
        uint32_t supported_version = quicly_decode32(&src);
        switch (supported_version) {
        case QUICLY_PROTOCOL_VERSION_CURRENT:
            selected_version = QUICLY_PROTOCOL_VERSION_CURRENT;
            break;
        case QUICLY_PROTOCOL_VERSION_DRAFT27:
            if (selected_version == 0)
                selected_version = QUICLY_PROTOCOL_VERSION_DRAFT27;
            break;
        }
    }
    if (selected_version == 0)
        return handle_close(conn, QUICLY_ERROR_NO_COMPATIBLE_VERSION, UINT64_MAX, ptls_iovec_init("", 0));

    return negotiate_using_version(conn, selected_version);
}